

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_kiss.cpp
# Opt level: O0

void __thiscall
ear::WorkBufKiss<double>::WorkBufKiss
          (WorkBufKiss<double> *this,size_t n_fft,kissfft<double> *plan_forward,
          kissfft<double> *plan_reverse)

{
  kissfft<double> *pkVar1;
  allocator<std::complex<double>_> local_36;
  allocator<std::complex<double>_> local_35 [13];
  kissfft<double> *local_28;
  kissfft<double> *plan_reverse_local;
  kissfft<double> *plan_forward_local;
  size_t n_fft_local;
  WorkBufKiss<double> *this_local;
  
  local_28 = plan_reverse;
  plan_reverse_local = plan_forward;
  plan_forward_local = (kissfft<double> *)n_fft;
  n_fft_local = (size_t)this;
  FFTWorkBuf::FFTWorkBuf(&this->super_FFTWorkBuf);
  (this->super_FFTWorkBuf)._vptr_FFTWorkBuf = (_func_int **)&PTR__WorkBufKiss_00286b60;
  kissfft<double>::kissfft(&this->plan_forward,plan_forward);
  kissfft<double>::kissfft(&this->plan_reverse,plan_reverse);
  pkVar1 = plan_forward_local;
  std::allocator<std::complex<double>_>::allocator(local_35);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->reverse_tmp_input,(size_type)pkVar1,local_35);
  std::allocator<std::complex<double>_>::~allocator(local_35);
  pkVar1 = plan_forward_local;
  std::allocator<std::complex<double>_>::allocator(&local_36);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->reverse_tmp_output,(size_type)pkVar1,&local_36);
  std::allocator<std::complex<double>_>::~allocator(&local_36);
  return;
}

Assistant:

WorkBufKiss(size_t n_fft, kissfft<Real> plan_forward,
                kissfft<Real> plan_reverse)
        : plan_forward(plan_forward),
          plan_reverse(plan_reverse),
          reverse_tmp_input(n_fft),
          reverse_tmp_output(n_fft) {}